

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::SplitterBehavior
               (ImRect *bb,ImGuiID id,ImGuiAxis axis,float *size1,float *size2,float min_size1,
               float min_size2,float hover_extend,float hover_visibility_delay)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  ImGuiAxis IVar3;
  float *pfVar4;
  float *pfVar5;
  bool bVar6;
  ImU32 col;
  ImGuiCol idx;
  byte bVar7;
  uint uVar8;
  float fVar9;
  float fVar10;
  undefined4 in_XMM2_Db;
  undefined4 in_XMM2_Dc;
  undefined4 in_XMM2_Dd;
  float fVar11;
  float fVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  bool held;
  bool hovered;
  bool local_9a;
  bool local_99;
  float local_98;
  float local_94;
  float local_90;
  ImGuiAxis local_8c;
  undefined1 local_88 [16];
  float *local_78;
  float *local_70;
  ImVec2 local_68;
  ImVec2 aIStack_60 [2];
  ImGuiWindow *local_50;
  ImRect local_48;
  
  pIVar2 = GImGui;
  local_88._4_4_ = in_XMM2_Db;
  local_88._0_4_ = hover_extend;
  local_88._8_4_ = in_XMM2_Dc;
  local_88._12_4_ = in_XMM2_Dd;
  pIVar1 = GImGui->CurrentWindow;
  uVar8 = (pIVar1->DC).ItemFlags;
  (pIVar1->DC).ItemFlags = uVar8 | 0x18;
  local_98 = hover_visibility_delay;
  local_94 = min_size1;
  local_90 = min_size2;
  local_8c = axis;
  local_78 = size1;
  local_70 = size2;
  local_50 = pIVar1;
  bVar6 = ItemAdd(bb,id,(ImRect *)0x0);
  IVar3 = local_8c;
  (pIVar1->DC).ItemFlags = uVar8;
  bVar7 = 0;
  if (bVar6) {
    fVar10 = (float)(local_88._0_4_ & (int)((uint)(local_8c == ImGuiAxis_Y) << 0x1f) >> 0x1f);
    fVar9 = (float)(~((int)((uint)(local_8c == ImGuiAxis_Y) << 0x1f) >> 0x1f) & local_88._0_4_);
    local_48.Min.x = (bb->Min).x;
    local_48.Min.y = (bb->Min).y;
    local_48.Max.x = (bb->Max).x;
    local_48.Max.y = (bb->Max).y;
    local_48.Min.y = local_48.Min.y - fVar10;
    local_48.Min.x = local_48.Min.x - fVar9;
    local_48.Max.y = fVar10 + local_48.Max.y;
    local_48.Max.x = fVar9 + local_48.Max.x;
    ButtonBehavior(&local_48,id,&local_99,&local_9a,0x180);
    if (pIVar2->ActiveId != id) {
      SetItemAllowOverlap();
    }
    if ((local_9a != false) ||
       (((pIVar2->HoveredId == id && (pIVar2->HoveredIdPreviousFrame == id)) &&
        (local_98 <= pIVar2->HoveredIdTimer)))) {
      SetMouseCursor((IVar3 != ImGuiAxis_Y) + 3);
    }
    pfVar5 = local_70;
    pfVar4 = local_78;
    local_68 = bb->Min;
    aIStack_60[0] = bb->Max;
    if ((local_9a & 1U) != 0) {
      if (IVar3 == ImGuiAxis_Y) {
        fVar9 = ((pIVar2->IO).MousePos.y - (pIVar2->ActiveIdClickOffset).y) - local_48.Min.y;
      }
      else {
        fVar9 = ((pIVar2->IO).MousePos.x - (pIVar2->ActiveIdClickOffset).x) - local_48.Min.x;
      }
      fVar11 = *local_78 - local_94;
      fVar10 = (float)(~-(uint)(*local_70 - local_90 <= 0.0) & (uint)(*local_70 - local_90));
      fVar12 = -fVar11;
      uVar8 = -(uint)(fVar11 <= fVar12);
      fVar11 = (float)(~uVar8 & (uint)fVar12 | uVar8 & 0x80000000);
      if (fVar11 <= fVar9) {
        fVar11 = fVar9;
      }
      if (fVar11 <= fVar10) {
        fVar10 = fVar11;
      }
      if ((fVar10 != 0.0) || (NAN(fVar10))) {
        uVar13 = 0;
        uVar14 = 0;
        uVar15 = 0;
        if ((fVar10 < 0.0) && (*local_78 + fVar10 < local_94)) {
          local_88 = ZEXT416((uint)fVar10);
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                      ,0x56e,"SplitterBehavior","ImGui ASSERT FAILED: %s",
                      "*size1 + mouse_delta >= min_size1");
          fVar10 = (float)local_88._0_4_;
          uVar13 = local_88._4_4_;
          uVar14 = local_88._8_4_;
          uVar15 = local_88._12_4_;
        }
        if ((0.0 < fVar10) && (*pfVar5 - fVar10 < local_90)) {
          local_88._4_4_ = uVar13;
          local_88._0_4_ = fVar10;
          local_88._8_4_ = uVar14;
          local_88._12_4_ = uVar15;
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                      ,0x570,"SplitterBehavior","ImGui ASSERT FAILED: %s",
                      "*size2 - mouse_delta >= min_size2");
          fVar10 = (float)local_88._0_4_;
        }
        *pfVar4 = *pfVar4 + fVar10;
        *pfVar5 = *pfVar5 - fVar10;
        fVar9 = (float)((uint)fVar10 & (int)((uint)(IVar3 == ImGuiAxis_X) << 0x1f) >> 0x1f);
        fVar10 = (float)(~((int)((uint)(IVar3 == ImGuiAxis_X) << 0x1f) >> 0x1f) & (uint)fVar10);
        local_68.y = fVar10 + local_68.y;
        local_68.x = fVar9 + local_68.x;
        aIStack_60[0].y = fVar10 + aIStack_60[0].y;
        aIStack_60[0].x = fVar9 + aIStack_60[0].x;
        MarkItemEdited(id);
      }
    }
    idx = 0x1d;
    if (((local_9a & 1U) == 0) && (idx = 0x1b, local_99 == true)) {
      idx = 0x1c - (uint)(pIVar2->HoveredIdTimer < local_98);
    }
    col = GetColorU32(idx,1.0);
    ImDrawList::AddRectFilled(local_50->DrawList,&local_68,aIStack_60,col,0.0,0xf);
    bVar7 = local_9a;
  }
  return (bool)bVar7;
}

Assistant:

bool ImGui::SplitterBehavior(const ImRect& bb, ImGuiID id, ImGuiAxis axis, float* size1, float* size2, float min_size1, float min_size2, float hover_extend, float hover_visibility_delay)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    const ImGuiItemFlags item_flags_backup = window->DC.ItemFlags;
    window->DC.ItemFlags |= ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus;
    bool item_add = ItemAdd(bb, id);
    window->DC.ItemFlags = item_flags_backup;
    if (!item_add)
        return false;

    bool hovered, held;
    ImRect bb_interact = bb;
    bb_interact.Expand(axis == ImGuiAxis_Y ? ImVec2(0.0f, hover_extend) : ImVec2(hover_extend, 0.0f));
    ButtonBehavior(bb_interact, id, &hovered, &held, ImGuiButtonFlags_FlattenChildren | ImGuiButtonFlags_AllowItemOverlap);
    if (g.ActiveId != id)
        SetItemAllowOverlap();

    if (held || (g.HoveredId == id && g.HoveredIdPreviousFrame == id && g.HoveredIdTimer >= hover_visibility_delay))
        SetMouseCursor(axis == ImGuiAxis_Y ? ImGuiMouseCursor_ResizeNS : ImGuiMouseCursor_ResizeEW);

    ImRect bb_render = bb;
    if (held)
    {
        ImVec2 mouse_delta_2d = g.IO.MousePos - g.ActiveIdClickOffset - bb_interact.Min;
        float mouse_delta = (axis == ImGuiAxis_Y) ? mouse_delta_2d.y : mouse_delta_2d.x;

        // Minimum pane size
        float size_1_maximum_delta = ImMax(0.0f, *size1 - min_size1);
        float size_2_maximum_delta = ImMax(0.0f, *size2 - min_size2);
        if (mouse_delta < -size_1_maximum_delta)
            mouse_delta = -size_1_maximum_delta;
        if (mouse_delta > size_2_maximum_delta)
            mouse_delta = size_2_maximum_delta;

        // Apply resize
        if (mouse_delta != 0.0f)
        {
            if (mouse_delta < 0.0f)
                IM_ASSERT(*size1 + mouse_delta >= min_size1);
            if (mouse_delta > 0.0f)
                IM_ASSERT(*size2 - mouse_delta >= min_size2);
            *size1 += mouse_delta;
            *size2 -= mouse_delta;
            bb_render.Translate((axis == ImGuiAxis_X) ? ImVec2(mouse_delta, 0.0f) : ImVec2(0.0f, mouse_delta));
            MarkItemEdited(id);
        }
    }

    // Render
    const ImU32 col = GetColorU32(held ? ImGuiCol_SeparatorActive : (hovered && g.HoveredIdTimer >= hover_visibility_delay) ? ImGuiCol_SeparatorHovered : ImGuiCol_Separator);
    window->DrawList->AddRectFilled(bb_render.Min, bb_render.Max, col, 0.0f);

    return held;
}